

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_utilities.h
# Opt level: O0

bool Gudhi::persistence_matrix::
     _add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>
               (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
                *source,Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
                        *targetColumn)

{
  bool bVar1;
  anon_class_1_0_00000001 local_2b;
  anon_class_1_0_00000001 local_2a;
  anon_class_1_0_00000001 local_29;
  anon_class_8_1_e4bd5e45 local_28;
  anon_class_1_0_00000001 local_19;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
  *local_18;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
  *targetColumn_local;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
  *source_local;
  
  local_28.targetColumn = targetColumn;
  local_18 = targetColumn;
  targetColumn_local = source;
  bVar1 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persist___ue,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>__Matrix_column_tag_1u>_false>___1_>
                    (source,targetColumn,&local_19,&local_28,&local_29,&local_2a,&local_2b);
  return bVar1;
}

Assistant:

bool _add_to_column(const Entry_range& source, Column& targetColumn)
{
  return _generic_add_to_column(
      source,
      targetColumn,
      [&]([[maybe_unused]] typename Column::Entry* entryTarget) {},
      [&](typename Entry_range::const_iterator& itSource, const typename Column::Column_support::iterator& itTarget) {
        if constexpr (Column::Master::Option_list::is_z2) {
          targetColumn._insert_entry(itSource->get_row_index(), itTarget);
        } else {
          targetColumn._insert_entry(itSource->get_element(), itSource->get_row_index(), itTarget);
        }
      },
      [&](typename Column::Field_element& targetElement, typename Entry_range::const_iterator& itSource) {
        if constexpr (!Column::Master::Option_list::is_z2)
          targetColumn.operators_->add_inplace(targetElement, itSource->get_element());
      },
      [&]([[maybe_unused]] typename Column::Entry* entryTarget) {},
      [&]([[maybe_unused]] typename Column::Column_support::iterator& itTarget) {}
    );
}